

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Poppify.cpp
# Opt level: O2

void __thiscall wasm::anon_unknown_18::Poppifier::poppify(Poppifier *this,Expression *expr)

{
  Expression **ppEVar1;
  undefined1 auStack_108 [8];
  Poppifier poppifier;
  Expression *expr_local;
  
  auStack_108 = (undefined1  [8])0x0;
  poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.replacep = (Expression **)0x0;
  poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.fixed._M_elems[9].currp =
       (Expression **)0x0;
  poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
  super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._1_7_ = 0;
  poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.currFunction._0_1_ = 0;
  poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>._201_8_ = 0;
  poppifier._216_8_ = (this->builder).wasm;
  poppifier.builder.wasm = (Module *)expr;
  Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::pushTask
            ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)auStack_108,
             wasm::(anonymous_namespace)::Poppifier::poppify(wasm::Expression*)::Poppifier::
             scan(Poppifier*,wasm::Expression___,(Expression **)&poppifier.builder);
  while( true ) {
    if (((long)poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
               super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
               super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
               ._M_impl.super__Vector_impl_data._M_start -
         (long)poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
               super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.fixed._M_elems[9].
               currp >> 4) +
        (long)poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
              super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.replacep == 0) {
      Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::~Walker
                ((Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_> *)auStack_108);
      return;
    }
    if ((pointer)poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                 super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.fixed._M_elems[9].
                 currp ==
        poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
        super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
        super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      if (poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
          super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.replacep == (Expression **)0x0) {
        __assert_fail("usedFixed > 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_vector.h"
                      ,0x7e,
                      "T &wasm::SmallVector<wasm::Walker<Poppifier, wasm::Visitor<Poppifier>>::Task, 10>::back() [T = wasm::Walker<Poppifier, wasm::Visitor<Poppifier>>::Task, N = 10]"
                     );
      }
      ppEVar1 = poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.fixed._M_elems
                [(long)poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                       super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.replacep + -2].currp
      ;
      auStack_108 = (undefined1  [8])
                    poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                    super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.fixed._M_elems
                    [(long)poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                           super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.replacep + -1].
                    func;
      poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
      super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.replacep =
           (Expression **)
           ((long)poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                  super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.replacep + -1);
    }
    else {
      ppEVar1 = (Expression **)
                poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
                super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
                ._M_impl.super__Vector_impl_data._M_start[-1].func;
      auStack_108 = (undefined1  [8])
                    poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
                    super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
                    super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start[-1].currp;
      poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
      super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
      super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start =
           poppifier.super_PostWalker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.
           super_Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>.stack.flexible.
           super__Vector_base<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task,_std::allocator<wasm::Walker<Poppifier,_wasm::Visitor<Poppifier,_void>_>::Task>_>
           ._M_impl.super__Vector_impl_data._M_start + -1;
    }
    if (*(Expression **)auStack_108 == (Expression *)0x0) break;
    (*(code *)ppEVar1)((Poppifier *)auStack_108,(Expression **)auStack_108);
  }
  __assert_fail("*task.currp",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-traversal.h"
                ,0x132,
                "void wasm::Walker<Poppifier, wasm::Visitor<Poppifier>>::walk(Expression *&) [SubType = Poppifier, VisitorType = wasm::Visitor<Poppifier>]"
               );
}

Assistant:

void Poppifier::poppify(Expression* expr) {
  struct Poppifier : PostWalker<Poppifier> {
    bool scanned = false;
    Builder builder;
    Poppifier(Builder& builder) : builder(builder) {}

    static void scan(Poppifier* self, Expression** currp) {
      if (!self->scanned) {
        self->scanned = true;
        PostWalker<Poppifier>::scan(self, currp);
      } else {
        *currp = self->builder.makePop((*currp)->type);
      }
    }
  } poppifier(builder);
  poppifier.walk(expr);
}